

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

_Bool enum_dir_next(DIR *dp,int index,strbuf *out)

{
  size_t new_len;
  int iVar1;
  strbuf *buf_o;
  char *str;
  ptrlen pVar2;
  size_t baselen;
  char *sessiondir;
  strbuf *fullpath;
  stat st;
  dirent *de;
  strbuf *out_local;
  int index_local;
  DIR *dp_local;
  
  if (dp == (DIR *)0x0) {
    dp_local._7_1_ = false;
  }
  else {
    buf_o = strbuf_new();
    str = make_filename(index,(char *)0x0);
    pVar2 = ptrlen_from_asciz(str);
    BinarySink_put_datapl(buf_o->binarysink_,pVar2);
    safefree(str);
    BinarySink_put_byte(buf_o->binarysink_,'/');
    new_len = buf_o->len;
    do {
      st.__glibc_reserved[2] = (__syscall_slong_t)readdir((DIR *)dp);
      if ((dirent *)st.__glibc_reserved[2] == (dirent *)0x0) {
        strbuf_free(buf_o);
        return false;
      }
      strbuf_shrink_to(buf_o,new_len);
      pVar2 = ptrlen_from_asciz((char *)(st.__glibc_reserved[2] + 0x13));
      BinarySink_put_datapl(buf_o->binarysink_,pVar2);
      iVar1 = stat(buf_o->s,(stat *)&fullpath);
    } while ((iVar1 < 0) || (((uint)st.st_nlink & 0xf000) != 0x8000));
    decode_session_filename((char *)(st.__glibc_reserved[2] + 0x13),out);
    strbuf_free(buf_o);
    dp_local._7_1_ = true;
  }
  return dp_local._7_1_;
}

Assistant:

static bool enum_dir_next(DIR *dp, int index, strbuf *out)
{
    struct dirent *de;
    struct stat st;
    strbuf *fullpath;

    if (!dp)
        return false;

    fullpath = strbuf_new();

    char *sessiondir = make_filename(index, NULL);
    put_dataz(fullpath, sessiondir);
    sfree(sessiondir);
    put_byte(fullpath, '/');

    size_t baselen = fullpath->len;

    while ( (de = readdir(dp)) != NULL ) {
        strbuf_shrink_to(fullpath, baselen);
        put_dataz(fullpath, de->d_name);

        if (stat(fullpath->s, &st) < 0 || !S_ISREG(st.st_mode))
            continue;                  /* try another one */

        decode_session_filename(de->d_name, out);
        strbuf_free(fullpath);
        return true;
    }

    strbuf_free(fullpath);
    return false;
}